

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# initest.c
# Opt level: O0

void hrstep2(double *inp,int N,int m,int p,int q,int pq,double *a,double *sos,double *var)

{
  double *sig;
  double *col;
  double *C;
  double *C_00;
  double *x;
  int *ipiv_00;
  double local_70;
  double wmean;
  int t;
  int k;
  int j;
  int i;
  int *ipiv;
  double *temp;
  double *b;
  double *A;
  double *zt;
  double *z;
  int pq_local;
  int q_local;
  int p_local;
  int m_local;
  int N_local;
  double *inp_local;
  
  sig = (double *)malloc((long)((N - m) - q) * 8 * (long)pq);
  col = (double *)malloc((long)((N - m) - q) * 8 * (long)pq);
  C = (double *)malloc((long)pq * 8 * (long)pq);
  C_00 = (double *)malloc((long)pq << 3);
  x = (double *)malloc((long)pq << 3);
  ipiv_00 = (int *)malloc((long)pq << 2);
  for (k = 0; k < (N - m) - q; k = k + 1) {
    for (t = 0; t < p; t = t + 1) {
      sig[k * pq + t] = inp[((m + q + k) - t) + -1];
    }
    for (wmean._4_4_ = 0; wmean._4_4_ < q; wmean._4_4_ = wmean._4_4_ + 1) {
      sig[k * pq + p + wmean._4_4_] = -a[((m + q + k) - wmean._4_4_) + -1];
    }
  }
  mtranspose(sig,(N - m) - q,pq,col);
  mmult(col,sig,C,pq,(N - m) - q,pq);
  mmult(col,inp + (long)m + (long)q,C_00,pq,(N - m) - q,1);
  ludecomp(C,pq,ipiv_00);
  linsolve(C,pq,C_00,ipiv_00,x);
  *sos = 0.0;
  for (wmean._0_4_ = m + q; wmean._0_4_ < N; wmean._0_4_ = wmean._0_4_ + 1) {
    local_70 = inp[wmean._0_4_];
    for (k = 0; k < p; k = k + 1) {
      local_70 = -x[k] * inp[(wmean._0_4_ - k) + -1] + local_70;
    }
    for (k = 0; k < q; k = k + 1) {
      local_70 = x[k + p] * a[(wmean._0_4_ - k) + -1] + local_70;
    }
    *sos = local_70 * local_70 + *sos;
  }
  *var = *sos / (double)((N - m) - q);
  free(sig);
  free(col);
  free(C);
  free(C_00);
  free(ipiv_00);
  free(x);
  return;
}

Assistant:

void hrstep2(double *inp, int N, int m, int p, int q, int pq, double *a, double *sos, double *var) {
	double *z, *zt, *A, *b, *temp;
	int *ipiv;
	int i,j,k,t;
	double wmean;

	z = (double*)malloc(sizeof(double)* (N - m - q) * pq);
	zt = (double*)malloc(sizeof(double)* (N - m - q) * pq);
	A = (double*)malloc(sizeof(double)* pq * pq);
	b = (double*)malloc(sizeof(double)* pq);
	temp = (double*)malloc(sizeof(double)* pq);
	ipiv = (int*)malloc(sizeof(int)* pq);

	for (i = 0; i < N - m - q; ++i) {
		t = i * pq;
		for (j = 0; j < p; ++j) {
			z[t + j] = inp[m + q + i - j - 1];
		}

		for (k = 0; k < q; ++k) {
			z[t + p + k] = -a[m + q + i - k - 1];
		}
	}

	mtranspose(z, N - m - q, pq, zt);
	mmult(zt, z, A, pq, N - m - q, pq);
	mmult(zt, inp + m + q, b, pq, N - m - q, 1);


	ludecomp(A, pq, ipiv);
	linsolve(A, pq, b, ipiv, temp);

	*sos = 0.0;

	for (t = m + q; t < N; ++t) {
		wmean = inp[t];
		for (i = 0; i < p; ++i) {
			wmean -= (temp[i] * inp[t - i - 1]);
		}

		for (i = 0; i < q; ++i) {
			wmean += (temp[i+p] * a[t - i - 1]);
		}

		*sos += (wmean*wmean);
	}

	*var = *sos / (N - m - q);

	free(z);
	free(zt);
	free(A);
	free(b);
	free(ipiv);
	free(temp);
}